

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# botp.c
# Opt level: O0

bool_t botpOCRAStepV(char *otp,octet *q,size_t q_len,tm_time_t t,void *state)

{
  int iVar1;
  void *in_RDX;
  tm_time_t in_RSI;
  size_t in_RDI;
  char *in_R8;
  botp_ocra_st *st;
  char *str1;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  str1 = in_R8;
  memCopy(in_R8,in_R8,0x16c510);
  botpOCRAStepR((char *)st,(octet *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                in_RDI,in_RSI,in_RDX);
  iVar1 = strCmp(str1,in_R8);
  if (iVar1 != 0) {
    memCopy(str1,in_R8,0x16c572);
  }
  return (uint)(iVar1 == 0);
}

Assistant:

bool_t botpOCRAStepV(const char* otp, const octet q[], size_t q_len, 
	tm_time_t t, void* state)
{
	botp_ocra_st* st = (botp_ocra_st*)state;
	// pre
	ASSERT(strIsValid(otp));
	ASSERT(memIsDisjoint2(otp, strLen(otp) + 1, state, botpOCRA_keep()));
	// сохранить счетчик
	memCopy(st->ctr1, st->ctr, 8);
	// проверить пароль
	botpOCRAStepR(st->otp, q, q_len, t, state);
	if (strEq(st->otp, otp))
		return TRUE;
	// вернуться к первоначальному счетчику
	memCopy(st->ctr, st->ctr1, 8);
	return FALSE;
}